

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::ClassType::computeCycles(ClassType *this)

{
  bool bVar1;
  Type *this_00;
  ClassType *this_01;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar2;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __begin2;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> local_28;
  
  Scope::ensureElaborated(&this->super_Scope);
  (this->cachedHasCycles).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
  sVar2 = Scope::membersOfType<slang::ast::ClassPropertySymbol>(&this->super_Scope);
  local_28 = sVar2._M_begin.current;
  while( true ) {
    if (local_28.current == sVar2._M_end.current.current) {
      (this->cachedHasCycles).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x100;
      return;
    }
    this_00 = DeclaredType::getType((DeclaredType *)(local_28.current + 1));
    this_01 = (ClassType *)Type::getCanonicalType(this_00);
    bVar1 = Type::isClass((Type *)this_01);
    if ((bVar1) && (bVar1 = hasCycles(this_01), bVar1)) break;
    Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>::increment(&local_28);
  }
  return;
}

Assistant:

void ClassType::computeCycles() const {
    // Start out by setting hasCycles to true, so that if we call into
    // hasCycles() in a re-entrant fashion we'll see this result right away.
    ensureElaborated();
    cachedHasCycles = true;

    for (auto& prop : membersOfType<ClassPropertySymbol>()) {
        auto& propType = prop.getType().getCanonicalType();
        if (propType.isClass() && propType.as<ClassType>().hasCycles())
            return;
    }

    cachedHasCycles = false;
}